

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProto2NamespaceEnumSpecializations
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  pointer this_01;
  Options *extraout_RDX;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  undefined1 local_80 [8];
  NamespaceOpener proto_ns;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  bVar1 = HasEnumDefinitions(this->file_);
  if (bVar1) {
    Formatter::operator()<>((Formatter *)local_50,"\n");
    ProtobufNamespace_abi_cxx11_((string *)local_a0,(cpp *)&this->options_,extraout_RDX);
    NamespaceOpener::NamespaceOpener
              ((NamespaceOpener *)local_80,(string *)local_a0,(Formatter *)local_50);
    std::__cxx11::string::~string((string *)local_a0);
    Formatter::operator()<>((Formatter *)local_50,"\n");
    for (local_a4 = 0;
        sVar2 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                ::size(&this->enum_generators_), (ulong)(long)local_a4 < sVar2;
        local_a4 = local_a4 + 1) {
      this_00 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                ::operator[](&this->enum_generators_,(long)local_a4);
      this_01 = std::
                unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                ::operator->(this_00);
      EnumGenerator::GenerateGetEnumDescriptorSpecializations
                (this_01,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    Formatter::operator()<>((Formatter *)local_50,"\n");
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_80);
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateProto2NamespaceEnumSpecializations(
    io::Printer* printer) {
  Formatter format(printer, variables_);
  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasEnumDefinitions(file_)) {
    format("\n");
    {
      NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
      format("\n");
      for (int i = 0; i < enum_generators_.size(); i++) {
        enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
      }
      format("\n");
    }
  }
}